

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

void __thiscall psy::C::Lexer::lexIntegerSuffix(Lexer *this,int suffixCnt)

{
  byte bVar1;
  
  if (suffixCnt != 0) {
    bVar1 = this->yychar_;
    do {
      if (bVar1 < 0x6c) {
        if (bVar1 != 0x4c) {
          if (bVar1 != 0x55) {
            return;
          }
          goto LAB_002b1a30;
        }
        yyinput(this);
        bVar1 = this->yychar_;
        if (bVar1 == 0x4c) {
LAB_002b1a6b:
          yyinput(this);
          bVar1 = this->yychar_;
        }
LAB_002b1a77:
        if ((bVar1 | 0x20) != 0x75) {
          return;
        }
      }
      else {
        if (bVar1 == 0x6c) {
          yyinput(this);
          bVar1 = this->yychar_;
          if (bVar1 == 0x6c) goto LAB_002b1a6b;
          goto LAB_002b1a77;
        }
        if (bVar1 != 0x75) {
          return;
        }
LAB_002b1a30:
        yyinput(this);
        bVar1 = this->yychar_;
        if ((bVar1 | 0x20) != 0x6c) {
          return;
        }
      }
      suffixCnt = suffixCnt + -1;
    } while (suffixCnt != 0);
  }
  return;
}

Assistant:

void Lexer::lexIntegerSuffix(int suffixCnt)
{
    if (!suffixCnt)
        return;

    switch(yychar_) {
        case 'u':
        case 'U':
            yyinput();
            switch (yychar_) {
                case 'l':
                case 'L':
                    lexIntegerSuffix(--suffixCnt);
                    break;
            }
            break;

        case 'l':
            yyinput();
            if (yychar_ == 'l')
                yyinput();
            switch (yychar_) {
                case 'u':
                case 'U':
                    lexIntegerSuffix(--suffixCnt);
                    break;
            }
            break;

        case 'L':
            yyinput();
            if (yychar_ == 'L')
                yyinput();
            switch (yychar_) {
                case 'u':
                case 'U':
                    lexIntegerSuffix(--suffixCnt);
                    break;
            }
            break;
    }
}